

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O0

void __thiscall JUnitTestOutput::writeFailure(JUnitTestOutput *this,JUnitTestCaseResultNode *node)

{
  char *pcVar1;
  ulong uVar2;
  char *pcVar3;
  SimpleString local_88;
  SimpleString local_78;
  SimpleString local_68;
  SimpleString local_58 [2];
  SimpleString local_38;
  undefined1 local_28 [8];
  SimpleString buf;
  JUnitTestCaseResultNode *node_local;
  JUnitTestOutput *this_local;
  
  buf.bufferSize_ = (size_t)node;
  (*node->failure_->_vptr_TestFailure[2])();
  pcVar1 = SimpleString::asCharString(&local_38);
  uVar2 = (**(code **)(**(long **)(buf.bufferSize_ + 0x18) + 0x28))();
  (**(code **)(**(long **)(buf.bufferSize_ + 0x18) + 0x30))(&local_68);
  (*(this->super_TestOutput)._vptr_TestOutput[0x20])(local_58,this,&local_68);
  pcVar3 = SimpleString::asCharString(local_58);
  StringFromFormat(local_28,"<failure message=\"%s:%d: %s\" type=\"AssertionFailedError\">\n",pcVar1
                   ,uVar2 & 0xffffffff,pcVar3);
  SimpleString::~SimpleString(local_58);
  SimpleString::~SimpleString(&local_68);
  SimpleString::~SimpleString(&local_38);
  pcVar1 = SimpleString::asCharString((SimpleString *)local_28);
  SimpleString::SimpleString(&local_78,pcVar1);
  (*(this->super_TestOutput)._vptr_TestOutput[0x1a])(this,&local_78);
  SimpleString::~SimpleString(&local_78);
  SimpleString::SimpleString(&local_88,"</failure>\n");
  (*(this->super_TestOutput)._vptr_TestOutput[0x1a])(this,&local_88);
  SimpleString::~SimpleString(&local_88);
  SimpleString::~SimpleString((SimpleString *)local_28);
  return;
}

Assistant:

void JUnitTestOutput::writeFailure(JUnitTestCaseResultNode* node)
{
    SimpleString buf = StringFromFormat(
            "<failure message=\"%s:%d: %s\" type=\"AssertionFailedError\">\n",
            node->failure_->getFileName().asCharString(),
            (int) node->failure_->getFailureLineNumber(),
            encodeXmlText(node->failure_->getMessage()).asCharString());
    writeToFile(buf.asCharString());
    writeToFile("</failure>\n");
}